

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

bool fmt::v5::internal::grisu2_round
               (char *buf,int *size,int max_digits,uint64_t delta,uint64_t remainder,uint64_t exp,
               uint64_t diff,int *exp10)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar1 = delta - remainder;
  uVar2 = diff - remainder;
  for (; ((remainder < diff && (bVar3 = exp <= uVar1, uVar1 = uVar1 - exp, bVar3)) &&
         ((remainder + exp < diff || (remainder + (exp - diff) < uVar2)))); uVar2 = uVar2 - exp) {
    buf[(long)*size + -1] = buf[(long)*size + -1] + -1;
    remainder = remainder + exp;
  }
  if (max_digits < *size) {
    *size = *size + -1;
    *exp10 = *exp10 + 1;
    if ('4' < buf[*size]) {
      return false;
    }
  }
  return true;
}

Assistant:

FMT_FUNC bool grisu2_round(
    char *buf, int &size, int max_digits, uint64_t delta,
    uint64_t remainder, uint64_t exp, uint64_t diff, int &exp10) {
  while (remainder < diff && delta - remainder >= exp &&
        (remainder + exp < diff || diff - remainder > remainder + exp - diff)) {
    --buf[size - 1];
    remainder += exp;
  }
  if (size > max_digits) {
    --size;
    ++exp10;
    if (buf[size] >= '5')
      return false;
  }
  return true;
}